

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O0

ssize_t __thiscall UniValue::write_abi_cxx11_(UniValue *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint indentLevel;
  uint prettyIndent;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  uint modIndent;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  UniValue *this_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar3;
  UniValue *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prettyIndent = (uint)__buf;
  indentLevel = (uint)__n;
  uVar3 = 0;
  this_00 = this;
  this_01 = (UniValue *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (ulong)((UniValue *)CONCAT44(in_register_00000034,__fd))->typ;
  switch(__lhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__lhs,(char *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    writeObject(this_01,prettyIndent,indentLevel,(string *)CONCAT17(uVar3,in_stack_ffffffffffffff78)
               );
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    writeArray(this_01,prettyIndent,indentLevel,(string *)CONCAT17(uVar3,in_stack_ffffffffffffff78))
    ;
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    json_escape((string *)CONCAT44(prettyIndent,indentLevel));
    std::operator+((char *)this,__lhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)__lhs);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    std::__cxx11::string::~string(in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(in_stack_ffffffffffffff38);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
    bVar2 = std::operator==(__lhs,(char *)CONCAT17(in_stack_ffffffffffffff47,
                                                   in_stack_ffffffffffffff40));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__lhs,(char *)CONCAT17(bVar2,in_stack_ffffffffffffff40));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (ssize_t)this;
}

Assistant:

std::string UniValue::write(unsigned int prettyIndent,
                            unsigned int indentLevel) const
{
    std::string s;
    s.reserve(1024);

    unsigned int modIndent = indentLevel;
    if (modIndent == 0)
        modIndent = 1;

    switch (typ) {
    case VNULL:
        s += "null";
        break;
    case VOBJ:
        writeObject(prettyIndent, modIndent, s);
        break;
    case VARR:
        writeArray(prettyIndent, modIndent, s);
        break;
    case VSTR:
        s += "\"" + json_escape(val) + "\"";
        break;
    case VNUM:
        s += val;
        break;
    case VBOOL:
        s += (val == "1" ? "true" : "false");
        break;
    }

    return s;
}